

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChDirectSolverLS.cpp
# Opt level: O2

void __thiscall chrono::ChDirectSolverLS::ChDirectSolverLS(ChDirectSolverLS *this)

{
  undefined1 auVar1 [16];
  
  ChSolverLS::ChSolverLS(&this->super_ChSolverLS);
  (this->super_ChSolverLS).super_ChSolver._vptr_ChSolver =
       (_func_int **)&PTR__ChDirectSolverLS_01185670;
  Eigen::SparseMatrix<double,_1,_int>::SparseMatrix(&this->m_mat);
  this->m_dim = 0;
  this->m_symmetry = GENERAL;
  this->m_sparsity = (double)&DAT_bff0000000000000;
  (this->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (this->m_sol).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->m_sol).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  *(undefined8 *)
   ((long)&(this->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows + 1) = 0;
  *(undefined8 *)
   ((long)&(this->m_sol).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data + 1) = 0;
  *(undefined8 *)
   ((long)&(this->m_sol).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows + 1) = 0;
  *(undefined8 *)((long)&this->m_solve_call + 1) = 0;
  auVar1 = ZEXT416(0) << 0x40;
  this->m_use_learner = true;
  this->m_force_update = true;
  this->m_use_perm = false;
  this->m_use_rhs_sparsity = false;
  this->m_null_pivot_detection = false;
  (this->m_timer_setup_assembly).m_start = (time_point)auVar1._0_8_;
  (this->m_timer_setup_assembly).m_end = (time_point)auVar1._8_8_;
  (this->m_timer_setup_solvercall).m_start = (time_point)auVar1._0_8_;
  (this->m_timer_setup_solvercall).m_end = (time_point)auVar1._8_8_;
  (this->m_timer_solve_assembly).m_start = (time_point)auVar1._0_8_;
  (this->m_timer_solve_assembly).m_end = (time_point)auVar1._8_8_;
  (this->m_timer_solve_solvercall).m_start = (time_point)auVar1._0_8_;
  (this->m_timer_solve_solvercall).m_end = (time_point)auVar1._8_8_;
  return;
}

Assistant:

ChDirectSolverLS::ChDirectSolverLS()
    : m_lock(false),
      m_use_learner(true),
      m_force_update(true),
      m_null_pivot_detection(false),
      m_use_rhs_sparsity(false),
      m_use_perm(false),
      m_symmetry(MatrixSymmetryType::GENERAL),
      m_dim(0),
      m_sparsity(-1),
      m_solve_call(0),
      m_setup_call(0) {}